

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void wl_keyboard_handle_keymap(void *data,wl_keyboard *keyboard,uint format,int fd,uint size)

{
  void *__addr;
  undefined8 uVar1;
  
  __addr = mmap((void *)0x0,(ulong)size,1,1,fd,0);
  uVar1 = xkb_keymap_new_from_string(*(undefined8 *)((long)data + 0x38),__addr,1,0);
  *(undefined8 *)((long)data + 0x40) = uVar1;
  munmap(__addr,(ulong)size);
  close(fd);
  uVar1 = xkb_state_new(*(undefined8 *)((long)data + 0x40));
  *(undefined8 *)((long)data + 0x48) = uVar1;
  return;
}

Assistant:

static void wl_keyboard_handle_keymap(void *data, struct wl_keyboard *keyboard, unsigned int format, int fd, unsigned int size)
{
  struct wl_data *wl_data = data;
  char *string;

  string = mmap(NULL, size, PROT_READ, MAP_SHARED, fd, 0);
  wl_data->xkb_keymap = xkb_map_new_from_string(wl_data->xkb_context, string, XKB_KEYMAP_FORMAT_TEXT_V1, XKB_MAP_COMPILE_NO_FLAGS);
  munmap(string, size);
  close(fd);

  wl_data->xkb_state = xkb_state_new(wl_data->xkb_keymap);
}